

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2PartialMatch(void)

{
  bool bVar1;
  ostream *poVar2;
  LogMessage local_c48;
  RE2 local_ac8;
  StringPiece local_9e8;
  LogMessage local_9d8;
  RE2 local_858;
  StringPiece local_778;
  LogMessage local_768;
  RE2 local_5e8;
  StringPiece local_508;
  LogMessage local_4f8;
  RE2 local_378;
  StringPiece local_298;
  LogMessage local_288;
  RE2 local_f8;
  StringPiece local_18;
  
  StringPiece::StringPiece(&local_18,"x");
  RE2::RE2(&local_f8,"x");
  bVar1 = RE2::PartialMatch<>(&local_18,&local_f8);
  RE2::~RE2(&local_f8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x249);
    poVar2 = LogMessage::stream(&local_288);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"x\", \"x\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_288);
  }
  StringPiece::StringPiece(&local_298,"hello");
  RE2::RE2(&local_378,"h.*o");
  bVar1 = RE2::PartialMatch<>(&local_298,&local_378);
  RE2::~RE2(&local_378);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_4f8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24a);
    poVar2 = LogMessage::stream(&local_4f8);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"hello\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_4f8);
  }
  StringPiece::StringPiece(&local_508,"othello");
  RE2::RE2(&local_5e8,"h.*o");
  bVar1 = RE2::PartialMatch<>(&local_508,&local_5e8);
  RE2::~RE2(&local_5e8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_768,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24b);
    poVar2 = LogMessage::stream(&local_768);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"othello\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_768);
  }
  StringPiece::StringPiece(&local_778,"hello!");
  RE2::RE2(&local_858,"h.*o");
  bVar1 = RE2::PartialMatch<>(&local_778,&local_858);
  RE2::~RE2(&local_858);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9d8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24c);
    poVar2 = LogMessage::stream(&local_9d8);
    std::operator<<(poVar2,"Check failed: RE2::PartialMatch(\"hello!\", \"h.*o\")");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9d8);
  }
  StringPiece::StringPiece(&local_9e8,"x");
  RE2::RE2(&local_ac8,"((((((((((((((((((((x))))))))))))))))))))");
  bVar1 = RE2::PartialMatch<>(&local_9e8,&local_ac8);
  RE2::~RE2(&local_ac8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_c48,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x24d);
    poVar2 = LogMessage::stream(&local_c48);
    std::operator<<(poVar2,
                    "Check failed: RE2::PartialMatch(\"x\", \"((((((((((((((((((((x))))))))))))))))))))\")"
                   );
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_c48);
  }
  return;
}

Assistant:

TEST(RE2, PartialMatch) {
  CHECK(RE2::PartialMatch("x", "x"));
  CHECK(RE2::PartialMatch("hello", "h.*o"));
  CHECK(RE2::PartialMatch("othello", "h.*o"));
  CHECK(RE2::PartialMatch("hello!", "h.*o"));
  CHECK(RE2::PartialMatch("x", "((((((((((((((((((((x))))))))))))))))))))"));
}